

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

int __thiscall QToolButtonPrivate::init(QToolButtonPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QWidget *this_00;
  QToolBar *pQVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QToolButton *q;
  undefined8 in_stack_ffffffffffffff48;
  FocusPolicy policy;
  code *this_01;
  QWidget *in_stack_ffffffffffffff50;
  Policy in_stack_ffffffffffffff58;
  Policy in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff68;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy_00;
  QStyleOption *opt;
  Connection *this_02;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar4;
  ConnectionType type;
  Object *receiverPrivate;
  QWidget *sender;
  Connection in_stack_ffffffffffffffd0;
  offset_in_QAbstractButton_to_subr signal;
  long local_8;
  
  policy_00.data = (quint32)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  policy = (FocusPolicy)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)q_func(this);
  this->defaultAction = (QAction *)0x0;
  pQVar2 = qobject_cast<QToolBar*>((QObject *)0x708c61);
  if (pQVar2 == (QToolBar *)0x0) {
    this->field_0x2ec = this->field_0x2ec & 0xf7;
  }
  else {
    this->field_0x2ec = this->field_0x2ec & 0xf7 | 8;
  }
  this->arrowType = NoArrow;
  this->field_0x2ec = this->field_0x2ec & 0xfb;
  this->popupMode = DelayedPopup;
  this->field_0x2ec = this->field_0x2ec & 0xfc;
  this->toolButtonStyle = ToolButtonIconOnly;
  *(undefined4 *)&(this->super_QAbstractButtonPrivate).field_0x2b4 = 0;
  QWidget::setFocusPolicy(in_stack_ffffffffffffff50,policy);
  uVar4 = 0;
  sender = this_00;
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)this_00,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
             (ControlType)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  QWidget::setSizePolicy(this_00,(QSizePolicy)policy_00);
  type = AutoConnection;
  receiverPrivate = (Object *)0x0;
  signal = 0;
  opt = (QStyleOption *)&stack0xffffffffffffffe8;
  QObjectPrivate::connect<void(QAbstractButton::*)(),void(QToolButtonPrivate::*)()>
            ((Object *)sender,0,(Object *)0x0,(Function)in_stack_ffffffffffffffd0.d_ptr,
             AutoConnection);
  QMetaObject::Connection::~Connection((Connection *)opt);
  this_01 = onButtonReleased;
  this_02 = (Connection *)&stack0xffffffffffffffd0;
  QObjectPrivate::connect<void(QAbstractButton::*)(),void(QToolButtonPrivate::*)()>
            ((Object *)sender,signal,receiverPrivate,(Function)in_stack_ffffffffffffffd0.d_ptr,type)
  ;
  QMetaObject::Connection::~Connection(this_02);
  QWidgetPrivate::setLayoutItemMargins
            ((QWidgetPrivate *)CONCAT44(uVar4,in_stack_ffffffffffffff78),
             (SubElement)((ulong)this_02 >> 0x20),opt);
  pQVar3 = QWidget::style((QWidget *)this_01);
  iVar1 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x34,uVar4,sender);
  this->delay = iVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QToolButtonPrivate::init()
{
    Q_Q(QToolButton);
    defaultAction = nullptr;
#if QT_CONFIG(toolbar)
    if (qobject_cast<QToolBar*>(parent))
        autoRaise = true;
    else
#endif
        autoRaise = false;
    arrowType = Qt::NoArrow;
    menuButtonDown = false;
    popupMode = QToolButton::DelayedPopup;
    buttonPressed = QToolButtonPrivate::NoButtonPressed;

    toolButtonStyle = Qt::ToolButtonIconOnly;
    hoverControl = QStyle::SC_None;

    q->setFocusPolicy(Qt::TabFocus);
    q->setSizePolicy(QSizePolicy(QSizePolicy::Fixed, QSizePolicy::Fixed,
                                 QSizePolicy::ToolButton));

#if QT_CONFIG(menu)
    QObjectPrivate::connect(q, &QAbstractButton::pressed,
                            this, &QToolButtonPrivate::onButtonPressed);
    QObjectPrivate::connect(q, &QAbstractButton::released,
                            this, &QToolButtonPrivate::onButtonReleased);
#endif

    setLayoutItemMargins(QStyle::SE_ToolButtonLayoutItem);
    delay = q->style()->styleHint(QStyle::SH_ToolButton_PopupDelay, nullptr, q);
}